

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O1

void embree::avx2::SphereMiMBIntersectorK<8,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float fVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  byte bVar5;
  Scene *pSVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 extraout_var [56];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  float fVar53;
  float fVar61;
  undefined1 auVar54 [16];
  float fVar59;
  float fVar60;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar62 [36];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [28];
  undefined1 auVar84 [64];
  undefined1 auVar85 [28];
  undefined1 auVar87 [64];
  undefined1 auVar88 [28];
  undefined1 auVar89 [64];
  undefined1 in_ZMM13 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [28];
  undefined1 auVar92 [64];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  SphereIntersectorHitM<8> hit;
  HitK<8> h;
  RTCFilterFunctionNArguments local_3f0;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_330 [16];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  uint local_1a0 [4];
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  uint local_c0;
  uint uStack_bc;
  uint uStack_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar58 [64];
  undefined1 auVar73 [64];
  undefined1 auVar76 [64];
  undefined1 auVar83 [32];
  undefined1 auVar86 [32];
  
  pSVar6 = context->scene;
  local_1a0[0] = sphere->sharedGeomID;
  uVar31 = (ulong)(sphere->primIDs).field_0.i[0];
  pGVar7 = (pSVar6->geometries).items[local_1a0[0]].ptr;
  fVar1 = (pGVar7->time_range).lower;
  fVar1 = pGVar7->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0xe0) - fVar1) / ((pGVar7->time_range).upper - fVar1));
  auVar14 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar14 = vminss_avx(auVar14,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar14 = vmaxss_avx(ZEXT816(0) << 0x20,auVar14);
  lVar8 = *(long *)&pGVar7[2].numPrimitives;
  lVar30 = (long)(int)auVar14._0_4_ * 0x38;
  lVar9 = *(long *)(lVar8 + lVar30);
  lVar10 = *(long *)(lVar8 + 0x10 + lVar30);
  uVar28 = (ulong)(sphere->primIDs).field_0.i[1];
  uVar29 = (ulong)(sphere->primIDs).field_0.i[4];
  auVar49._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar29);
  auVar49._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar31);
  uVar32 = (ulong)(sphere->primIDs).field_0.i[5];
  auVar55._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar32);
  auVar55._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar28);
  uVar34 = (ulong)(sphere->primIDs).field_0.i[2];
  uVar33 = (ulong)(sphere->primIDs).field_0.i[3];
  uVar35 = (ulong)(sphere->primIDs).field_0.i[6];
  auVar63._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar35);
  auVar63._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar34);
  uVar26 = (ulong)(sphere->primIDs).field_0.i[7];
  auVar67._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar26);
  auVar67._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar33);
  lVar9 = *(long *)(lVar8 + 0x38 + lVar30);
  lVar8 = *(long *)(lVar8 + 0x48 + lVar30);
  auVar70._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar29 * lVar8);
  auVar70._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar31 * lVar8);
  auVar74._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar32 * lVar8);
  auVar74._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar28 * lVar8);
  auVar77._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar35 * lVar8);
  auVar77._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar34 * lVar8);
  auVar79._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar8 * uVar26);
  auVar79._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar33 * lVar8);
  bVar5 = sphere->numPrimitives;
  auVar50._1_3_ = 0;
  auVar50[0] = bVar5;
  fVar1 = fVar1 - auVar14._0_4_;
  auVar56 = vunpcklps_avx(auVar49,auVar63);
  auVar47 = vunpckhps_avx(auVar49,auVar63);
  auVar52 = vunpcklps_avx(auVar55,auVar67);
  auVar49 = vunpckhps_avx(auVar55,auVar67);
  auVar55 = vunpcklps_avx(auVar56,auVar52);
  auVar56 = vunpckhps_avx(auVar56,auVar52);
  auVar45 = vunpcklps_avx(auVar47,auVar49);
  auVar47 = vunpckhps_avx(auVar47,auVar49);
  auVar93 = vunpcklps_avx(auVar70,auVar77);
  auVar49 = vunpckhps_avx(auVar70,auVar77);
  auVar16 = vunpcklps_avx(auVar74,auVar79);
  auVar52 = vunpckhps_avx(auVar74,auVar79);
  auVar17 = vunpcklps_avx(auVar93,auVar16);
  auVar93 = vunpckhps_avx(auVar93,auVar16);
  auVar16 = vunpcklps_avx(auVar49,auVar52);
  auVar49 = vunpckhps_avx(auVar49,auVar52);
  fVar15 = 1.0 - fVar1;
  auVar80._4_4_ = fVar15;
  auVar80._0_4_ = fVar15;
  auVar80._8_4_ = fVar15;
  auVar80._12_4_ = fVar15;
  auVar80._16_4_ = fVar15;
  auVar80._20_4_ = fVar15;
  auVar80._24_4_ = fVar15;
  auVar80._28_4_ = fVar15;
  auVar36._8_4_ = 0x3f800000;
  auVar36._0_8_ = &DAT_3f8000003f800000;
  auVar36._12_4_ = 0x3f800000;
  auVar36._16_4_ = 0x3f800000;
  auVar36._20_4_ = 0x3f800000;
  auVar36._24_4_ = 0x3f800000;
  auVar36._28_4_ = 0x3f800000;
  auVar52._4_4_ = auVar17._4_4_ * fVar1;
  auVar52._0_4_ = auVar17._0_4_ * fVar1;
  auVar52._8_4_ = auVar17._8_4_ * fVar1;
  auVar52._12_4_ = auVar17._12_4_ * fVar1;
  auVar52._16_4_ = auVar17._16_4_ * fVar1;
  auVar52._20_4_ = auVar17._20_4_ * fVar1;
  auVar52._24_4_ = auVar17._24_4_ * fVar1;
  auVar52._28_4_ = auVar17._28_4_;
  auVar78._0_4_ = fVar1 * auVar93._0_4_;
  auVar78._4_4_ = fVar1 * auVar93._4_4_;
  auVar78._8_4_ = fVar1 * auVar93._8_4_;
  auVar78._12_4_ = fVar1 * auVar93._12_4_;
  auVar78._16_4_ = fVar1 * auVar93._16_4_;
  auVar78._20_4_ = fVar1 * auVar93._20_4_;
  auVar78._28_36_ = in_ZMM13._28_36_;
  auVar78._24_4_ = fVar1 * auVar93._24_4_;
  auVar17._4_4_ = fVar1 * auVar16._4_4_;
  auVar17._0_4_ = fVar1 * auVar16._0_4_;
  auVar17._8_4_ = fVar1 * auVar16._8_4_;
  auVar17._12_4_ = fVar1 * auVar16._12_4_;
  auVar17._16_4_ = fVar1 * auVar16._16_4_;
  auVar17._20_4_ = fVar1 * auVar16._20_4_;
  auVar17._24_4_ = fVar1 * auVar16._24_4_;
  auVar17._28_4_ = auVar16._28_4_;
  auVar16._4_4_ = fVar1 * auVar49._4_4_;
  auVar16._0_4_ = fVar1 * auVar49._0_4_;
  auVar16._8_4_ = fVar1 * auVar49._8_4_;
  auVar16._12_4_ = fVar1 * auVar49._12_4_;
  auVar16._16_4_ = fVar1 * auVar49._16_4_;
  auVar16._20_4_ = fVar1 * auVar49._20_4_;
  auVar16._24_4_ = fVar1 * auVar49._24_4_;
  auVar16._28_4_ = auVar93._28_4_;
  auVar14 = vfmadd231ps_fma(auVar52,auVar80,auVar55);
  auVar54 = vfmadd231ps_fma(auVar78._0_32_,auVar80,auVar56);
  auVar18 = vfmadd231ps_fma(auVar17,auVar80,auVar45);
  auVar19 = vfmadd231ps_fma(auVar16,auVar80,auVar47);
  auVar50[4] = bVar5;
  auVar50._5_3_ = 0;
  auVar50[8] = bVar5;
  auVar50._9_3_ = 0;
  auVar50[0xc] = bVar5;
  auVar50._13_3_ = 0;
  auVar50[0x10] = bVar5;
  auVar50._17_3_ = 0;
  auVar50[0x14] = bVar5;
  auVar50._21_3_ = 0;
  auVar50[0x18] = bVar5;
  auVar50._25_3_ = 0;
  auVar50[0x1c] = bVar5;
  auVar50._29_3_ = 0;
  auVar55 = vpcmpgtd_avx2(auVar50,_DAT_0205a920);
  local_1a0[1] = local_1a0[0];
  local_1a0[2] = local_1a0[0];
  local_1a0[3] = local_1a0[0];
  uStack_190 = local_1a0[0];
  uStack_18c = local_1a0[0];
  uStack_188 = local_1a0[0];
  uStack_184 = local_1a0[0];
  uVar2 = *(undefined4 *)(ray + k * 4);
  auVar56._4_4_ = uVar2;
  auVar56._0_4_ = uVar2;
  auVar56._8_4_ = uVar2;
  auVar56._12_4_ = uVar2;
  auVar56._16_4_ = uVar2;
  auVar56._20_4_ = uVar2;
  auVar56._24_4_ = uVar2;
  auVar56._28_4_ = uVar2;
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar64._4_4_ = uVar2;
  auVar64._0_4_ = uVar2;
  auVar64._8_4_ = uVar2;
  auVar64._12_4_ = uVar2;
  auVar64._16_4_ = uVar2;
  auVar64._20_4_ = uVar2;
  auVar64._24_4_ = uVar2;
  auVar64._28_4_ = uVar2;
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar68._4_4_ = uVar2;
  auVar68._0_4_ = uVar2;
  auVar68._8_4_ = uVar2;
  auVar68._12_4_ = uVar2;
  auVar68._16_4_ = uVar2;
  auVar68._20_4_ = uVar2;
  auVar68._24_4_ = uVar2;
  auVar68._28_4_ = uVar2;
  fVar1 = *(float *)(ray + k * 4 + 0x80);
  auVar83._4_4_ = fVar1;
  auVar83._0_4_ = fVar1;
  auVar83._8_4_ = fVar1;
  auVar83._12_4_ = fVar1;
  auVar83._16_4_ = fVar1;
  auVar83._20_4_ = fVar1;
  auVar83._24_4_ = fVar1;
  auVar83._28_4_ = fVar1;
  auVar84 = ZEXT3264(auVar83);
  fVar3 = *(float *)(ray + k * 4 + 0xa0);
  auVar86._4_4_ = fVar3;
  auVar86._0_4_ = fVar3;
  auVar86._8_4_ = fVar3;
  auVar86._12_4_ = fVar3;
  auVar86._16_4_ = fVar3;
  auVar86._20_4_ = fVar3;
  auVar86._24_4_ = fVar3;
  auVar86._28_4_ = fVar3;
  auVar87 = ZEXT3264(auVar86);
  fVar4 = *(float *)(ray + k * 4 + 0xc0);
  auVar89 = ZEXT3264(CONCAT428(fVar4,CONCAT424(fVar4,CONCAT420(fVar4,CONCAT416(fVar4,CONCAT412(fVar4
                                                  ,CONCAT48(fVar4,CONCAT44(fVar4,fVar4))))))));
  auVar49 = vsubps_avx(ZEXT1632(auVar14),auVar56);
  auVar14 = vfmadd231ps_fma(ZEXT432((uint)(fVar4 * fVar4)),auVar86,auVar86);
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar83,auVar83);
  auVar57._0_4_ = auVar14._0_4_;
  auVar57._4_4_ = auVar57._0_4_;
  auVar57._8_4_ = auVar57._0_4_;
  auVar57._12_4_ = auVar57._0_4_;
  auVar57._16_4_ = auVar57._0_4_;
  auVar57._20_4_ = auVar57._0_4_;
  auVar57._24_4_ = auVar57._0_4_;
  auVar57._28_4_ = auVar57._0_4_;
  auVar47 = vrcpps_avx(auVar57);
  auVar56 = vsubps_avx(ZEXT1632(auVar54),auVar64);
  auVar52 = vsubps_avx(ZEXT1632(auVar18),auVar68);
  auVar14 = vfnmadd231ps_fma(auVar36,auVar47,auVar57);
  auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar47,auVar47);
  auVar93._4_4_ = fVar4 * auVar52._4_4_;
  auVar93._0_4_ = fVar4 * auVar52._0_4_;
  auVar93._8_4_ = fVar4 * auVar52._8_4_;
  auVar93._12_4_ = fVar4 * auVar52._12_4_;
  auVar93._16_4_ = fVar4 * auVar52._16_4_;
  auVar93._20_4_ = fVar4 * auVar52._20_4_;
  auVar93._24_4_ = fVar4 * auVar52._24_4_;
  auVar93._28_4_ = auVar57._0_4_;
  auVar54 = vfmadd231ps_fma(auVar93,auVar56,auVar86);
  auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar49,auVar83);
  fVar53 = auVar54._0_4_ * auVar14._0_4_;
  fVar59 = auVar54._4_4_ * auVar14._4_4_;
  fVar60 = auVar54._8_4_ * auVar14._8_4_;
  fVar61 = auVar54._12_4_ * auVar14._12_4_;
  auVar71._0_4_ = fVar1 * fVar53;
  auVar71._4_4_ = fVar1 * fVar59;
  auVar71._8_4_ = fVar1 * fVar60;
  auVar71._12_4_ = fVar1 * fVar61;
  auVar71._16_4_ = fVar1 * 0.0;
  auVar71._20_4_ = fVar1 * 0.0;
  auVar71._24_4_ = fVar1 * 0.0;
  auVar71._28_4_ = 0;
  auVar45._4_4_ = fVar3 * fVar59;
  auVar45._0_4_ = fVar3 * fVar53;
  auVar45._8_4_ = fVar3 * fVar60;
  auVar45._12_4_ = fVar3 * fVar61;
  auVar45._16_4_ = fVar3 * 0.0;
  auVar45._20_4_ = fVar3 * 0.0;
  auVar45._24_4_ = fVar3 * 0.0;
  auVar45._28_4_ = auVar47._28_4_;
  auVar47._4_4_ = fVar4 * fVar59;
  auVar47._0_4_ = fVar4 * fVar53;
  auVar47._8_4_ = fVar4 * fVar60;
  auVar47._12_4_ = fVar4 * fVar61;
  auVar47._16_4_ = fVar4 * 0.0;
  auVar47._20_4_ = fVar4 * 0.0;
  auVar47._24_4_ = fVar4 * 0.0;
  auVar47._28_4_ = fVar15;
  auVar49 = vsubps_avx(auVar49,auVar71);
  auVar90 = ZEXT3264(auVar49);
  auVar93 = vsubps_avx(auVar56,auVar45);
  auVar78 = ZEXT3264(auVar93);
  auVar52 = vsubps_avx(auVar52,auVar47);
  auVar81 = ZEXT3264(auVar52);
  auVar20._4_4_ = auVar52._4_4_ * auVar52._4_4_;
  auVar20._0_4_ = auVar52._0_4_ * auVar52._0_4_;
  auVar20._8_4_ = auVar52._8_4_ * auVar52._8_4_;
  auVar20._12_4_ = auVar52._12_4_ * auVar52._12_4_;
  auVar20._16_4_ = auVar52._16_4_ * auVar52._16_4_;
  auVar20._20_4_ = auVar52._20_4_ * auVar52._20_4_;
  auVar20._24_4_ = auVar52._24_4_ * auVar52._24_4_;
  auVar20._28_4_ = auVar56._28_4_;
  auVar54 = vfmadd231ps_fma(auVar20,auVar93,auVar93);
  auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar49,auVar49);
  auVar45 = ZEXT1632(CONCAT412(auVar19._12_4_ * auVar19._12_4_,
                               CONCAT48(auVar19._8_4_ * auVar19._8_4_,
                                        CONCAT44(auVar19._4_4_ * auVar19._4_4_,
                                                 auVar19._0_4_ * auVar19._0_4_))));
  auVar47 = vcmpps_avx(ZEXT1632(auVar54),auVar45,2);
  auVar56 = auVar55 & auVar47;
  if ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar56 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar56 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar56 >> 0x7f,0) != '\0') ||
        (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar56 >> 0xbf,0) != '\0') ||
      (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar56[0x1f] < '\0') {
    auVar47 = vandps_avx(auVar47,auVar55);
    auVar18 = vpackssdw_avx(auVar47._0_16_,auVar47._16_16_);
    auVar47 = vsubps_avx(auVar45,ZEXT1632(auVar54));
    auVar37._0_4_ = auVar14._0_4_ * auVar47._0_4_;
    auVar37._4_4_ = auVar14._4_4_ * auVar47._4_4_;
    auVar37._8_4_ = auVar14._8_4_ * auVar47._8_4_;
    auVar37._12_4_ = auVar14._12_4_ * auVar47._12_4_;
    auVar37._16_4_ = auVar47._16_4_ * 0.0;
    auVar37._20_4_ = auVar47._20_4_ * 0.0;
    auVar37._24_4_ = auVar47._24_4_ * 0.0;
    auVar37._28_4_ = 0;
    auVar55 = vsqrtps_avx(auVar37);
    auVar92 = ZEXT3264(auVar55);
    auVar45 = vsubps_avx(ZEXT1632(CONCAT412(fVar61,CONCAT48(fVar60,CONCAT44(fVar59,fVar53)))),
                         auVar55);
    auVar72._0_4_ = auVar55._0_4_ + fVar53;
    auVar72._4_4_ = auVar55._4_4_ + fVar59;
    auVar72._8_4_ = auVar55._8_4_ + fVar60;
    auVar72._12_4_ = auVar55._12_4_ + fVar61;
    auVar72._16_4_ = auVar55._16_4_ + 0.0;
    auVar72._20_4_ = auVar55._20_4_ + 0.0;
    auVar72._24_4_ = auVar55._24_4_ + 0.0;
    auVar72._28_4_ = auVar55._28_4_ + 0.0;
    auVar73 = ZEXT3264(auVar72);
    uVar2 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar38._4_4_ = uVar2;
    auVar38._0_4_ = uVar2;
    auVar38._8_4_ = uVar2;
    auVar38._12_4_ = uVar2;
    auVar38._16_4_ = uVar2;
    auVar38._20_4_ = uVar2;
    auVar38._24_4_ = uVar2;
    auVar38._28_4_ = uVar2;
    auVar47 = vcmpps_avx(auVar38,auVar45,2);
    uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar65._4_4_ = uVar2;
    auVar65._0_4_ = uVar2;
    auVar65._8_4_ = uVar2;
    auVar65._12_4_ = uVar2;
    auVar65._16_4_ = uVar2;
    auVar65._20_4_ = uVar2;
    auVar65._24_4_ = uVar2;
    auVar65._28_4_ = uVar2;
    auVar56 = vcmpps_avx(auVar45,auVar65,2);
    auVar47 = vandps_avx(auVar47,auVar56);
    auVar14 = vpackssdw_avx(auVar47._0_16_,auVar47._16_16_);
    auVar54 = vpand_avx(auVar14,auVar18);
    auVar69 = ZEXT1664(auVar54);
    auVar47 = vcmpps_avx(auVar38,auVar72,2);
    auVar56 = vcmpps_avx(auVar72,auVar65,2);
    auVar47 = vandps_avx(auVar47,auVar56);
    auVar14 = vpackssdw_avx(auVar47._0_16_,auVar47._16_16_);
    auVar14 = vpand_avx(auVar14,auVar18);
    auVar18 = vpor_avx(auVar14,auVar54);
    local_3c0 = vpmovsxwd_avx2(auVar18);
    if ((((((((local_3c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_3c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_3c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_3c0 >> 0x7f,0) != '\0') ||
          (local_3c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_3c0 >> 0xbf,0) != '\0') ||
        (local_3c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_3c0[0x1f] < '\0') {
      auVar56 = vpmovsxwd_avx2(auVar54);
      local_320 = vblendvps_avx(auVar72,auVar45,auVar56);
      auVar46._0_8_ = auVar55._0_8_ ^ 0x8000000080000000;
      auVar46._8_4_ = -auVar55._8_4_;
      auVar46._12_4_ = -auVar55._12_4_;
      auVar46._16_4_ = -auVar55._16_4_;
      auVar46._20_4_ = -auVar55._20_4_;
      auVar46._24_4_ = -auVar55._24_4_;
      auVar46._28_4_ = -auVar55._28_4_;
      auVar47 = vblendvps_avx(auVar55,auVar46,auVar56);
      fVar15 = auVar47._0_4_;
      fVar53 = auVar47._4_4_;
      auVar21._4_4_ = fVar1 * fVar53;
      auVar21._0_4_ = fVar1 * fVar15;
      fVar59 = auVar47._8_4_;
      auVar21._8_4_ = fVar1 * fVar59;
      fVar60 = auVar47._12_4_;
      auVar21._12_4_ = fVar1 * fVar60;
      fVar61 = auVar47._16_4_;
      auVar21._16_4_ = fVar1 * fVar61;
      fVar12 = auVar47._20_4_;
      auVar21._20_4_ = fVar1 * fVar12;
      fVar13 = auVar47._24_4_;
      auVar21._24_4_ = fVar1 * fVar13;
      auVar21._28_4_ = 0x80000000;
      auVar22._4_4_ = fVar3 * fVar53;
      auVar22._0_4_ = fVar3 * fVar15;
      auVar22._8_4_ = fVar3 * fVar59;
      auVar22._12_4_ = fVar3 * fVar60;
      auVar22._16_4_ = fVar3 * fVar61;
      auVar22._20_4_ = fVar3 * fVar12;
      auVar22._24_4_ = fVar3 * fVar13;
      auVar22._28_4_ = auVar56._28_4_;
      auVar23._4_4_ = fVar4 * fVar53;
      auVar23._0_4_ = fVar4 * fVar15;
      auVar23._8_4_ = fVar4 * fVar59;
      auVar23._12_4_ = fVar4 * fVar60;
      auVar23._16_4_ = fVar4 * fVar61;
      auVar23._20_4_ = fVar4 * fVar12;
      auVar23._24_4_ = fVar4 * fVar13;
      auVar23._28_4_ = auVar47._28_4_;
      local_300 = vsubps_avx(auVar21,auVar49);
      local_2e0 = vsubps_avx(auVar22,auVar93);
      local_2c0 = vsubps_avx(auVar23,auVar52);
      auVar66 = ZEXT3264(local_320);
      auVar47 = vpmovzxwd_avx2(auVar18);
      auVar47 = vpslld_avx2(auVar47,0x1f);
      auVar75._8_4_ = 0x7f800000;
      auVar75._0_8_ = 0x7f8000007f800000;
      auVar75._12_4_ = 0x7f800000;
      auVar75._16_4_ = 0x7f800000;
      auVar75._20_4_ = 0x7f800000;
      auVar75._24_4_ = 0x7f800000;
      auVar75._28_4_ = 0x7f800000;
      auVar76 = ZEXT3264(auVar75);
      auVar47 = vblendvps_avx(auVar75,local_320,auVar47);
      auVar49 = vshufps_avx(auVar47,auVar47,0xb1);
      auVar49 = vminps_avx(auVar47,auVar49);
      auVar56 = vshufpd_avx(auVar49,auVar49,5);
      auVar49 = vminps_avx(auVar49,auVar56);
      auVar52 = vpermpd_avx2(auVar49,0x4e);
      auVar49 = vminps_avx(auVar49,auVar52);
      auVar49 = vcmpps_avx(auVar47,auVar49,0);
      auVar56 = local_3c0 & auVar49;
      auVar47 = local_3c0;
      if ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar56 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar56 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar56 >> 0x7f,0) != '\0') ||
            (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar56 >> 0xbf,0) != '\0') ||
          (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar56[0x1f] < '\0') {
        auVar47 = vandps_avx(auVar49,local_3c0);
      }
      uVar24 = vmovmskps_avx(auVar47);
      uVar25 = 0;
      for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x80000000) {
        uVar25 = uVar25 + 1;
      }
      iVar27 = 1 << ((uint)k & 0x1f);
      auVar39._4_4_ = iVar27;
      auVar39._0_4_ = iVar27;
      auVar39._8_4_ = iVar27;
      auVar39._12_4_ = iVar27;
      auVar39._16_4_ = iVar27;
      auVar39._20_4_ = iVar27;
      auVar39._24_4_ = iVar27;
      auVar39._28_4_ = iVar27;
      auVar49 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
      auVar94 = ZEXT3264(auVar49);
      auVar47 = vpand_avx2(auVar49,auVar39);
      local_360 = vpcmpeqd_avx2(auVar49,auVar47);
      do {
        auVar47 = auVar78._0_32_;
        local_3f0.hit = (RTCHitN *)&local_180;
        local_3f0.valid = (int *)local_380;
        auVar93 = auVar94._0_32_;
        auVar49 = auVar81._0_32_;
        auVar56 = auVar90._0_32_;
        auVar88 = auVar89._0_28_;
        auVar85 = auVar87._0_28_;
        auVar91 = auVar92._0_28_;
        auVar82 = auVar84._0_28_;
        auVar62 = ZEXT436(auVar52._28_4_);
        uVar26 = (ulong)uVar25;
        local_c0 = local_1a0[uVar26];
        pGVar7 = (pSVar6->geometries).items[local_c0].ptr;
        local_3f0.ray = (RTCRayN *)ray;
        if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          *(undefined4 *)(local_3c0 + uVar26 * 4) = 0;
          auVar62 = ZEXT436(auVar52._28_4_);
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar26 * 4);
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_300 + uVar26 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_2e0 + uVar26 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_2c0 + uVar26 * 4);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = 0;
            *(undefined4 *)(ray + k * 4 + 0x200) = 0;
            *(uint *)(ray + k * 4 + 0x220) = (sphere->primIDs).field_0.i[uVar26];
            *(uint *)(ray + k * 4 + 0x240) = local_c0;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
LAB_018fd342:
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar41._4_4_ = uVar2;
            auVar41._0_4_ = uVar2;
            auVar41._8_4_ = uVar2;
            auVar41._12_4_ = uVar2;
            auVar41._16_4_ = uVar2;
            auVar41._20_4_ = uVar2;
            auVar41._24_4_ = uVar2;
            auVar41._28_4_ = uVar2;
            auVar54 = vpand_avx(auVar69._0_16_,auVar14);
            local_320 = auVar73._0_32_;
            auVar52 = vcmpps_avx(local_320,auVar41,2);
            auVar14 = vpackssdw_avx(auVar52._0_16_,auVar52._16_16_);
            auVar14 = vpand_avx(auVar14,auVar54);
            auVar52 = vpmovzxwd_avx2(auVar14);
            auVar52 = vpslld_avx2(auVar52,0x1f);
            if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar52 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar52 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar52 >> 0x7f,0) == '\0') &&
                  (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar52 >> 0xbf,0) == '\0') &&
                (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar52[0x1f]) {
              return;
            }
            local_3c0 = vpsrad_avx2(auVar52,0x1f);
            fVar1 = auVar91._0_4_;
            auVar84._0_4_ = auVar82._0_4_ * fVar1;
            fVar3 = auVar91._4_4_;
            auVar84._4_4_ = auVar82._4_4_ * fVar3;
            fVar4 = auVar91._8_4_;
            auVar84._8_4_ = auVar82._8_4_ * fVar4;
            fVar15 = auVar91._12_4_;
            auVar84._12_4_ = auVar82._12_4_ * fVar15;
            fVar53 = auVar91._16_4_;
            auVar84._16_4_ = auVar82._16_4_ * fVar53;
            fVar59 = auVar91._20_4_;
            auVar84._20_4_ = auVar82._20_4_ * fVar59;
            fVar60 = auVar91._24_4_;
            auVar84._24_4_ = auVar82._24_4_ * fVar60;
            auVar84._28_36_ = auVar62;
            auVar87._0_4_ = auVar85._0_4_ * fVar1;
            auVar87._4_4_ = auVar85._4_4_ * fVar3;
            auVar87._8_4_ = auVar85._8_4_ * fVar4;
            auVar87._12_4_ = auVar85._12_4_ * fVar15;
            auVar87._16_4_ = auVar85._16_4_ * fVar53;
            auVar87._20_4_ = auVar85._20_4_ * fVar59;
            auVar87._28_36_ = auVar66._28_36_;
            auVar87._24_4_ = auVar85._24_4_ * fVar60;
            auVar89._0_4_ = auVar88._0_4_ * fVar1;
            auVar89._4_4_ = auVar88._4_4_ * fVar3;
            auVar89._8_4_ = auVar88._8_4_ * fVar4;
            auVar89._12_4_ = auVar88._12_4_ * fVar15;
            auVar89._16_4_ = auVar88._16_4_ * fVar53;
            auVar89._20_4_ = auVar88._20_4_ * fVar59;
            auVar89._28_36_ = auVar69._28_36_;
            auVar89._24_4_ = auVar88._24_4_ * fVar60;
            local_300 = vsubps_avx(auVar84._0_32_,auVar56);
            local_2e0 = vsubps_avx(auVar87._0_32_,auVar47);
            local_2c0 = vsubps_avx(auVar89._0_32_,auVar49);
            pSVar6 = context->scene;
            auVar47 = vblendvps_avx(auVar76._0_32_,local_320,auVar52);
            auVar56 = vshufps_avx(auVar47,auVar47,0xb1);
            auVar56 = vminps_avx(auVar47,auVar56);
            auVar52 = vshufpd_avx(auVar56,auVar56,5);
            auVar56 = vminps_avx(auVar56,auVar52);
            auVar52 = vpermpd_avx2(auVar56,0x4e);
            auVar56 = vminps_avx(auVar56,auVar52);
            auVar47 = vcmpps_avx(auVar47,auVar56,0);
            auVar54 = vpackssdw_avx(auVar47._0_16_,auVar47._16_16_);
            auVar14 = vpand_avx(auVar54,auVar14);
            auVar47 = vpmovzxwd_avx2(auVar14);
            auVar47 = vpslld_avx2(auVar47,0x1f);
            if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar47 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar47 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar47 >> 0x7f,0) == '\0') &&
                  (auVar47 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar47 >> 0xbf,0) == '\0') &&
                (auVar47 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar47[0x1f]) {
              auVar47 = local_3c0;
            }
            uVar24 = vmovmskps_avx(auVar47);
            uVar25 = 0;
            for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x80000000) {
              uVar25 = uVar25 + 1;
            }
            iVar27 = 1 << ((uint)k & 0x1f);
            auVar42._4_4_ = iVar27;
            auVar42._0_4_ = iVar27;
            auVar42._8_4_ = iVar27;
            auVar42._12_4_ = iVar27;
            auVar42._16_4_ = iVar27;
            auVar42._20_4_ = iVar27;
            auVar42._24_4_ = iVar27;
            auVar42._28_4_ = iVar27;
            auVar47 = vpand_avx2(auVar93,auVar42);
            auVar47 = vpcmpeqd_avx2(auVar93,auVar47);
            auVar78 = ZEXT3264(auVar47);
            auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar47 = vpcmpeqd_avx2(auVar49,auVar49);
            auVar84 = ZEXT3264(auVar47);
            do {
              local_3f0.hit = (RTCHitN *)&local_180;
              local_3f0.valid = (int *)local_380;
              uVar26 = (ulong)uVar25;
              local_c0 = local_1a0[uVar26];
              pGVar7 = (pSVar6->geometries).items[local_c0].ptr;
              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_3c0 + uVar26 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar26 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_300 + uVar26 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_2e0 + uVar26 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_2c0 + uVar26 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                  *(uint *)(ray + k * 4 + 0x220) = (sphere->primIDs).field_0.i[uVar26];
                  *(uint *)(ray + k * 4 + 0x240) = local_c0;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  return;
                }
                local_e0._4_4_ = (sphere->primIDs).field_0.i[uVar26];
                local_180 = *(undefined4 *)(local_300 + uVar26 * 4);
                local_160._4_4_ = *(undefined4 *)(local_2e0 + uVar26 * 4);
                uVar2 = *(undefined4 *)(local_2c0 + uVar26 * 4);
                local_140._4_4_ = uVar2;
                local_140._0_4_ = uVar2;
                local_140._8_4_ = uVar2;
                local_140._12_4_ = uVar2;
                local_140._16_4_ = uVar2;
                local_140._20_4_ = uVar2;
                local_140._24_4_ = uVar2;
                local_140._28_4_ = uVar2;
                uStack_17c = local_180;
                uStack_178 = local_180;
                uStack_174 = local_180;
                uStack_170 = local_180;
                uStack_16c = local_180;
                uStack_168 = local_180;
                uStack_164 = local_180;
                local_160._0_4_ = local_160._4_4_;
                local_160._8_4_ = local_160._4_4_;
                local_160._12_4_ = local_160._4_4_;
                local_160._16_4_ = local_160._4_4_;
                local_160._20_4_ = local_160._4_4_;
                local_160._24_4_ = local_160._4_4_;
                local_160._28_4_ = local_160._4_4_;
                local_100 = auVar81._0_32_;
                local_120 = auVar81._0_32_;
                local_e0._0_4_ = local_e0._4_4_;
                local_e0._8_4_ = local_e0._4_4_;
                local_e0._12_4_ = local_e0._4_4_;
                local_e0._16_4_ = local_e0._4_4_;
                local_e0._20_4_ = local_e0._4_4_;
                local_e0._24_4_ = local_e0._4_4_;
                local_e0._28_4_ = local_e0._4_4_;
                uStack_bc = local_c0;
                uStack_b8 = local_c0;
                uStack_b4 = local_c0;
                uStack_b0 = local_c0;
                uStack_ac = local_c0;
                uStack_a8 = local_c0;
                uStack_a4 = local_c0;
                uStack_9c = context->user->instID[0];
                local_a0 = uStack_9c;
                uStack_98 = uStack_9c;
                uStack_94 = uStack_9c;
                uStack_90 = uStack_9c;
                uStack_8c = uStack_9c;
                uStack_88 = uStack_9c;
                uStack_84 = uStack_9c;
                uStack_7c = context->user->instPrimID[0];
                local_80 = uStack_7c;
                uStack_78 = uStack_7c;
                uStack_74 = uStack_7c;
                uStack_70 = uStack_7c;
                uStack_6c = uStack_7c;
                uStack_68 = uStack_7c;
                uStack_64 = uStack_7c;
                uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar26 * 4);
                local_380 = auVar78._0_32_;
                local_3f0.geometryUserPtr = pGVar7->userPtr;
                local_3f0.context = context->user;
                local_3f0.N = 8;
                local_3f0.ray = (RTCRayN *)ray;
                if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  local_3a0 = auVar73._0_32_;
                  auVar47 = ZEXT1632(auVar84._0_16_);
                  local_360 = local_380;
                  (*pGVar7->intersectionFilterN)(&local_3f0);
                  auVar47 = vpcmpeqd_avx2(auVar47,auVar47);
                  auVar84 = ZEXT3264(auVar47);
                  auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar78 = ZEXT3264(local_360);
                  auVar76 = ZEXT3264(CONCAT428(0x7f800000,
                                               CONCAT424(0x7f800000,
                                                         CONCAT420(0x7f800000,
                                                                   CONCAT416(0x7f800000,
                                                                             CONCAT412(0x7f800000,
                                                                                       CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  auVar73 = ZEXT3264(local_3a0);
                }
                auVar49 = vpcmpeqd_avx2(auVar81._0_32_,local_380);
                auVar47 = auVar84._0_32_ & ~auVar49;
                if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar47 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar47 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar47 >> 0x7f,0) == '\0') &&
                      (auVar47 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar47 >> 0xbf,0) == '\0') &&
                    (auVar47 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar47[0x1f]) {
                  auVar49 = auVar84._0_32_ ^ auVar49;
                }
                else {
                  p_Var11 = context->args->filter;
                  if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    local_3a0 = auVar73._0_32_;
                    local_360 = auVar78._0_32_;
                    auVar47 = ZEXT1632(auVar84._0_16_);
                    (*p_Var11)(&local_3f0);
                    auVar47 = vpcmpeqd_avx2(auVar47,auVar47);
                    auVar84 = ZEXT3264(auVar47);
                    auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar78 = ZEXT3264(local_360);
                    auVar76 = ZEXT3264(CONCAT428(0x7f800000,
                                                 CONCAT424(0x7f800000,
                                                           CONCAT420(0x7f800000,
                                                                     CONCAT416(0x7f800000,
                                                                               CONCAT412(0x7f800000,
                                                                                         CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                    auVar73 = ZEXT3264(local_3a0);
                  }
                  auVar56 = vpcmpeqd_avx2(auVar81._0_32_,local_380);
                  auVar49 = auVar84._0_32_ ^ auVar56;
                  auVar47 = auVar84._0_32_ & ~auVar56;
                  if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar47 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar47 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar47 >> 0x7f,0) != '\0') ||
                        (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar47 >> 0xbf,0) != '\0') ||
                      (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar47[0x1f] < '\0') {
                    auVar48._0_4_ = auVar84._0_4_ ^ auVar56._0_4_;
                    auVar48._4_4_ = auVar84._4_4_ ^ auVar56._4_4_;
                    auVar48._8_4_ = auVar84._8_4_ ^ auVar56._8_4_;
                    auVar48._12_4_ = auVar84._12_4_ ^ auVar56._12_4_;
                    auVar48._16_4_ = auVar84._16_4_ ^ auVar56._16_4_;
                    auVar48._20_4_ = auVar84._20_4_ ^ auVar56._20_4_;
                    auVar48._24_4_ = auVar84._24_4_ ^ auVar56._24_4_;
                    auVar48._28_4_ = auVar84._28_4_ ^ auVar56._28_4_;
                    auVar47 = vmaskmovps_avx(auVar48,*(undefined1 (*) [32])local_3f0.hit);
                    *(undefined1 (*) [32])(local_3f0.ray + 0x180) = auVar47;
                    auVar47 = vmaskmovps_avx(auVar48,*(undefined1 (*) [32])(local_3f0.hit + 0x20));
                    *(undefined1 (*) [32])(local_3f0.ray + 0x1a0) = auVar47;
                    auVar47 = vmaskmovps_avx(auVar48,*(undefined1 (*) [32])(local_3f0.hit + 0x40));
                    *(undefined1 (*) [32])(local_3f0.ray + 0x1c0) = auVar47;
                    auVar47 = vmaskmovps_avx(auVar48,*(undefined1 (*) [32])(local_3f0.hit + 0x60));
                    *(undefined1 (*) [32])(local_3f0.ray + 0x1e0) = auVar47;
                    auVar47 = vmaskmovps_avx(auVar48,*(undefined1 (*) [32])(local_3f0.hit + 0x80));
                    *(undefined1 (*) [32])(local_3f0.ray + 0x200) = auVar47;
                    auVar47 = vpmaskmovd_avx2(auVar48,*(undefined1 (*) [32])(local_3f0.hit + 0xa0));
                    *(undefined1 (*) [32])(local_3f0.ray + 0x220) = auVar47;
                    auVar47 = vpmaskmovd_avx2(auVar48,*(undefined1 (*) [32])(local_3f0.hit + 0xc0));
                    *(undefined1 (*) [32])(local_3f0.ray + 0x240) = auVar47;
                    auVar47 = vpmaskmovd_avx2(auVar48,*(undefined1 (*) [32])(local_3f0.hit + 0xe0));
                    *(undefined1 (*) [32])(local_3f0.ray + 0x260) = auVar47;
                    auVar47 = vpmaskmovd_avx2(auVar48,*(undefined1 (*) [32])(local_3f0.hit + 0x100))
                    ;
                    *(undefined1 (*) [32])(local_3f0.ray + 0x280) = auVar47;
                  }
                }
                if ((((((((auVar49 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar49 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar49 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar49 >> 0x7f,0) == '\0') &&
                      (auVar49 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar49 >> 0xbf,0) == '\0') &&
                    (auVar49 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar49[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
                }
                *(undefined4 *)(local_3c0 + uVar26 * 4) = 0;
                uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar43._4_4_ = uVar2;
                auVar43._0_4_ = uVar2;
                auVar43._8_4_ = uVar2;
                auVar43._12_4_ = uVar2;
                auVar43._16_4_ = uVar2;
                auVar43._20_4_ = uVar2;
                auVar43._24_4_ = uVar2;
                auVar43._28_4_ = uVar2;
                auVar47 = vcmpps_avx(auVar73._0_32_,auVar43,2);
                local_3c0 = vandps_avx(auVar47,local_3c0);
              }
              if ((((((((local_3c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_3c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_3c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_3c0 >> 0x7f,0) == '\0') &&
                    (local_3c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_3c0 >> 0xbf,0) == '\0') &&
                  (local_3c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_3c0[0x1f]) {
                return;
              }
              auVar47 = vblendvps_avx(auVar76._0_32_,auVar73._0_32_,local_3c0);
              auVar49 = vshufps_avx(auVar47,auVar47,0xb1);
              auVar49 = vminps_avx(auVar47,auVar49);
              auVar56 = vshufpd_avx(auVar49,auVar49,5);
              auVar49 = vminps_avx(auVar49,auVar56);
              auVar56 = vpermpd_avx2(auVar49,0x4e);
              auVar49 = vminps_avx(auVar49,auVar56);
              auVar49 = vcmpps_avx(auVar47,auVar49,0);
              auVar56 = local_3c0 & auVar49;
              auVar47 = local_3c0;
              if ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar56 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar56 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar56 >> 0x7f,0) != '\0') ||
                    (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar56 >> 0xbf,0) != '\0') ||
                  (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar56[0x1f] < '\0') {
                auVar47 = vandps_avx(auVar49,local_3c0);
              }
              uVar24 = vmovmskps_avx(auVar47);
              uVar25 = 0;
              for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x80000000) {
                uVar25 = uVar25 + 1;
              }
            } while( true );
          }
          local_1c0 = auVar66._0_32_;
          uVar25 = (sphere->primIDs).field_0.i[uVar26];
          local_e0._4_4_ = uVar25;
          local_e0._0_4_ = uVar25;
          local_e0._8_4_ = uVar25;
          local_e0._12_4_ = uVar25;
          local_e0._16_4_ = uVar25;
          local_e0._20_4_ = uVar25;
          local_e0._24_4_ = uVar25;
          local_e0._28_4_ = uVar25;
          local_180 = *(undefined4 *)(local_300 + uVar26 * 4);
          uVar2 = *(undefined4 *)(local_2e0 + uVar26 * 4);
          auVar54._4_4_ = uVar2;
          auVar54._0_4_ = uVar2;
          auVar54._8_4_ = uVar2;
          auVar54._12_4_ = uVar2;
          local_160._16_4_ = uVar2;
          local_160._0_16_ = auVar54;
          local_160._20_4_ = uVar2;
          local_160._24_4_ = uVar2;
          local_160._28_4_ = uVar2;
          auVar58 = ZEXT3264(local_160);
          local_140._4_4_ = *(undefined4 *)(local_2c0 + uVar26 * 4);
          uStack_17c = local_180;
          uStack_178 = local_180;
          uStack_174 = local_180;
          uStack_170 = local_180;
          uStack_16c = local_180;
          uStack_168 = local_180;
          uStack_164 = local_180;
          local_140._0_4_ = local_140._4_4_;
          local_140._8_4_ = local_140._4_4_;
          local_140._12_4_ = local_140._4_4_;
          local_140._16_4_ = local_140._4_4_;
          local_140._20_4_ = local_140._4_4_;
          local_140._24_4_ = local_140._4_4_;
          local_140._28_4_ = local_140._4_4_;
          auVar51 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          local_100 = auVar51;
          local_120 = auVar51;
          uStack_bc = local_c0;
          uStack_b8 = local_c0;
          uStack_b4 = local_c0;
          uStack_b0 = local_c0;
          uStack_ac = local_c0;
          uStack_a8 = local_c0;
          uStack_a4 = local_c0;
          auVar52 = vpcmpeqd_avx2(local_e0,local_e0);
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_320 + uVar26 * 4);
          local_380 = local_360;
          local_3f0.geometryUserPtr = pGVar7->userPtr;
          local_3f0.context = context->user;
          local_3f0.N = 8;
          if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            local_3a0 = auVar73._0_32_;
            local_1e0 = auVar84._0_32_;
            local_200 = auVar87._0_32_;
            local_220 = auVar89._0_32_;
            local_330 = auVar69._0_16_;
            auVar51._0_24_ = ZEXT1624((undefined1  [16])0x0);
            auVar51._24_8_ = 0;
            auVar58 = ZEXT1664(auVar54);
            local_2a0 = auVar92._0_32_;
            local_280 = auVar49;
            local_260 = auVar47;
            local_240 = auVar56;
            (*pGVar7->intersectionFilterN)(&local_3f0);
            auVar81._8_56_ = extraout_var;
            auVar81._0_8_ = extraout_XMM1_Qa;
            auVar52 = vpcmpeqd_avx2(auVar81._0_32_,auVar81._0_32_);
            auVar47 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
            auVar94 = ZEXT3264(auVar47);
            auVar69 = ZEXT1664(local_330);
            auVar92 = ZEXT3264(local_2a0);
            auVar81 = ZEXT3264(local_280);
            auVar78 = ZEXT3264(local_260);
            auVar90 = ZEXT3264(local_240);
            auVar89 = ZEXT3264(local_220);
            auVar87 = ZEXT3264(local_200);
            auVar84 = ZEXT3264(local_1e0);
            auVar76 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar73 = ZEXT3264(local_3a0);
          }
          auVar56 = auVar58._0_32_;
          auVar49 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),local_380);
          auVar47 = auVar52 & ~auVar49;
          auVar66 = ZEXT3264(local_1c0);
          if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar47 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar47 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar47 >> 0x7f,0) == '\0') &&
                (auVar47 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar47 >> 0xbf,0) == '\0') &&
              (auVar47 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar47[0x1f]) {
            auVar44 = ZEXT3264(auVar49 ^ auVar52);
          }
          else {
            p_Var11 = context->args->filter;
            if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
              local_3a0 = auVar73._0_32_;
              local_1e0 = auVar84._0_32_;
              local_200 = auVar87._0_32_;
              local_220 = auVar89._0_32_;
              local_240 = auVar90._0_32_;
              local_260 = auVar78._0_32_;
              local_280 = auVar81._0_32_;
              local_2a0 = auVar92._0_32_;
              local_330 = auVar69._0_16_;
              auVar51 = ZEXT1632(auVar51._0_16_);
              auVar56 = ZEXT1632(auVar58._0_16_);
              (*p_Var11)(&local_3f0);
              auVar66 = ZEXT3264(local_1c0);
              auVar47 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
              auVar94 = ZEXT3264(auVar47);
              auVar69 = ZEXT1664(local_330);
              auVar92 = ZEXT3264(local_2a0);
              auVar81 = ZEXT3264(local_280);
              auVar78 = ZEXT3264(local_260);
              auVar90 = ZEXT3264(local_240);
              auVar89 = ZEXT3264(local_220);
              auVar87 = ZEXT3264(local_200);
              auVar84 = ZEXT3264(local_1e0);
              auVar76 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar73 = ZEXT3264(local_3a0);
            }
            auVar49 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),local_380);
            auVar47 = vpcmpeqd_avx2(auVar56,auVar56);
            auVar58 = ZEXT3264(auVar47);
            auVar44 = ZEXT3264(auVar49 ^ auVar47);
            auVar56 = vpcmpeqd_avx2(auVar51,auVar51);
            auVar47 = auVar47 & ~auVar49;
            if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar47 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar47 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar47 >> 0x7f,0) != '\0') ||
                  (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar47 >> 0xbf,0) != '\0') ||
                (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar47[0x1f] < '\0') {
              auVar49 = auVar49 ^ auVar56;
              auVar47 = vmaskmovps_avx(auVar49,*(undefined1 (*) [32])local_3f0.hit);
              *(undefined1 (*) [32])(local_3f0.ray + 0x180) = auVar47;
              auVar47 = vmaskmovps_avx(auVar49,*(undefined1 (*) [32])(local_3f0.hit + 0x20));
              *(undefined1 (*) [32])(local_3f0.ray + 0x1a0) = auVar47;
              auVar47 = vmaskmovps_avx(auVar49,*(undefined1 (*) [32])(local_3f0.hit + 0x40));
              *(undefined1 (*) [32])(local_3f0.ray + 0x1c0) = auVar47;
              auVar47 = vmaskmovps_avx(auVar49,*(undefined1 (*) [32])(local_3f0.hit + 0x60));
              *(undefined1 (*) [32])(local_3f0.ray + 0x1e0) = auVar47;
              auVar47 = vmaskmovps_avx(auVar49,*(undefined1 (*) [32])(local_3f0.hit + 0x80));
              *(undefined1 (*) [32])(local_3f0.ray + 0x200) = auVar47;
              auVar47 = vpmaskmovd_avx2(auVar49,*(undefined1 (*) [32])(local_3f0.hit + 0xa0));
              *(undefined1 (*) [32])(local_3f0.ray + 0x220) = auVar47;
              auVar47 = vpmaskmovd_avx2(auVar49,*(undefined1 (*) [32])(local_3f0.hit + 0xc0));
              *(undefined1 (*) [32])(local_3f0.ray + 0x240) = auVar47;
              auVar47 = vpmaskmovd_avx2(auVar49,*(undefined1 (*) [32])(local_3f0.hit + 0xe0));
              *(undefined1 (*) [32])(local_3f0.ray + 0x260) = auVar47;
              auVar47 = vpmaskmovd_avx2(auVar49,*(undefined1 (*) [32])(local_3f0.hit + 0x100));
              *(undefined1 (*) [32])(local_3f0.ray + 0x280) = auVar47;
            }
          }
          auVar47 = auVar44._0_32_;
          if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar47 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar47 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar47 >> 0x7f,0) == '\0') &&
                (auVar44 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar47 >> 0xbf,0) == '\0') &&
              (auVar44 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar44[0x1f]) {
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
          }
          *(undefined4 *)(local_3c0 + uVar26 * 4) = 0;
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar40._4_4_ = uVar2;
          auVar40._0_4_ = uVar2;
          auVar40._8_4_ = uVar2;
          auVar40._12_4_ = uVar2;
          auVar40._16_4_ = uVar2;
          auVar40._20_4_ = uVar2;
          auVar40._24_4_ = uVar2;
          auVar40._28_4_ = uVar2;
          auVar47 = vcmpps_avx(auVar66._0_32_,auVar40,2);
          local_3c0 = vandps_avx(auVar47,local_3c0);
          auVar62 = auVar58._28_36_;
        }
        auVar47 = auVar78._0_32_;
        auVar93 = auVar94._0_32_;
        auVar49 = auVar81._0_32_;
        auVar56 = auVar90._0_32_;
        auVar88 = auVar89._0_28_;
        auVar85 = auVar87._0_28_;
        auVar91 = auVar92._0_28_;
        auVar82 = auVar84._0_28_;
        if ((((((((local_3c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_3c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_3c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_3c0 >> 0x7f,0) == '\0') &&
              (local_3c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_3c0 >> 0xbf,0) == '\0') &&
            (local_3c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_3c0[0x1f]) goto LAB_018fd342;
        auVar47 = vblendvps_avx(auVar76._0_32_,auVar66._0_32_,local_3c0);
        auVar49 = vshufps_avx(auVar47,auVar47,0xb1);
        auVar49 = vminps_avx(auVar47,auVar49);
        auVar56 = vshufpd_avx(auVar49,auVar49,5);
        auVar49 = vminps_avx(auVar49,auVar56);
        auVar52 = vpermpd_avx2(auVar49,0x4e);
        auVar49 = vminps_avx(auVar49,auVar52);
        auVar49 = vcmpps_avx(auVar47,auVar49,0);
        auVar56 = local_3c0 & auVar49;
        auVar47 = local_3c0;
        if ((((((((auVar56 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar56 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar56 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar56 >> 0x7f,0) != '\0') ||
              (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar56 >> 0xbf,0) != '\0') ||
            (auVar56 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar56[0x1f] < '\0') {
          auVar47 = vandps_avx(auVar49,local_3c0);
        }
        uVar24 = vmovmskps_avx(auVar47);
        uVar25 = 0;
        for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x80000000) {
          uVar25 = uVar25 + 1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = sphere.valid();
        SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }